

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

internal_node<char,_false> *
immutable::rrb_details::internal_node_dec<char,false>(internal_node<char,_false> *original)

{
  internal_node<char,_false> *piVar1;
  uint local_1c;
  uint32_t i;
  internal_node<char,_false> *node;
  internal_node<char,_false> *original_local;
  
  piVar1 = (internal_node<char,_false> *)malloc((ulong)(original->len - 1) * 8 + 0x20);
  piVar1->len = original->len - 1;
  piVar1->type = INTERNAL_NODE;
  (piVar1->size_table).ptr = (rrb_size_table<false> *)0x0;
  ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
            (&piVar1->size_table,&original->size_table);
  piVar1->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar1 + 1);
  memset(piVar1->child,0,(ulong)piVar1->len << 3);
  for (local_1c = 0; local_1c < piVar1->len; local_1c = local_1c + 1) {
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              (piVar1->child + local_1c,original->child + local_1c);
  }
  piVar1->guid = 0;
  return piVar1;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* internal_node_dec(const internal_node<T, atomic_ref_counting>* original)
      {
      internal_node<T, atomic_ref_counting>* node = (internal_node<T, atomic_ref_counting>*)malloc(sizeof(internal_node<T, atomic_ref_counting>) + (original->len - 1) * sizeof(ref<internal_node<T, atomic_ref_counting>>));
      node->len = original->len - 1;
      node->type = INTERNAL_NODE;
      node->size_table.ptr = nullptr;
      node->size_table = original->size_table;
      node->child = (ref<internal_node<T, atomic_ref_counting>>*)((char*)node + sizeof(internal_node<T, atomic_ref_counting>));
      memset(node->child, 0, node->len * sizeof(ref<internal_node<T, atomic_ref_counting>>)); // init pointers to zero      
      for (uint32_t i = 0; i < node->len; ++i)
        node->child[i] = original->child[i];
      node->guid = 0;
      return node;
      }